

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_tonumber(lua_State *L)

{
  char cVar1;
  int iVar2;
  lua_Integer lVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  byte *pbVar8;
  undefined8 unaff_R13;
  long lVar9;
  size_t l;
  size_t local_48;
  char *local_40;
  undefined8 local_38;
  
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    iVar2 = lua_type(L,1);
    if (iVar2 == 3) {
      lua_settop(L,1);
      return 1;
    }
    pcVar4 = lua_tolstring(L,1,&local_48);
    if ((pcVar4 != (char *)0x0) && (sVar6 = lua_stringtonumber(L,pcVar4), sVar6 == local_48 + 1)) {
      return 1;
    }
    luaL_checkany(L,1);
  }
  else {
    lVar3 = luaL_checkinteger(L,2);
    luaL_checktype(L,1,4);
    pcVar4 = lua_tolstring(L,1,&local_48);
    if (0x22 < lVar3 - 2U) {
      luaL_argerror(L,2,"base out of range");
    }
    sVar5 = strspn(pcVar4," \f\n\r\t\v");
    cVar1 = pcVar4[sVar5];
    pbVar8 = (byte *)(pcVar4 + ((cVar1 - 0x2bU & 0xfd) == 0) + sVar5);
    bVar7 = *pbVar8;
    iVar2 = isalnum((uint)bVar7);
    if (iVar2 == 0) {
      pbVar8 = (byte *)0x0;
      lVar3 = 0;
    }
    else {
      lVar9 = 0;
      local_40 = pcVar4;
      local_38 = CONCAT71((int7)((ulong)unaff_R13 >> 8),cVar1);
      do {
        if (bVar7 - 0x30 < 10) {
          iVar2 = (char)bVar7 + -0x30;
        }
        else {
          iVar2 = toupper((uint)bVar7);
          iVar2 = iVar2 + -0x37;
        }
        if ((int)lVar3 <= iVar2) {
          pbVar8 = (byte *)0x0;
          lVar3 = 0;
          pcVar4 = local_40;
          goto LAB_0015a4d3;
        }
        lVar9 = (long)iVar2 + lVar9 * (int)lVar3;
        bVar7 = pbVar8[1];
        pbVar8 = pbVar8 + 1;
        iVar2 = isalnum((uint)bVar7);
      } while (iVar2 != 0);
      sVar5 = strspn((char *)pbVar8," \f\n\r\t\v");
      pbVar8 = pbVar8 + sVar5;
      lVar3 = -lVar9;
      pcVar4 = local_40;
      if ((char)local_38 != '-') {
        lVar3 = lVar9;
      }
    }
LAB_0015a4d3:
    if (pbVar8 == (byte *)(pcVar4 + local_48)) {
      lua_pushinteger(L,lVar3);
      return 1;
    }
  }
  lua_pushnil(L);
  return 1;
}

Assistant:

static int luaB_tonumber (lua_State *L) {
  if (lua_isnoneornil(L, 2)) {  /* standard conversion? */
    if (lua_type(L, 1) == LUA_TNUMBER) {  /* already a number? */
      lua_settop(L, 1);  /* yes; return it */
      return 1;
    }
    else {
      size_t l;
      const char *s = lua_tolstring(L, 1, &l);
      if (s != NULL && lua_stringtonumber(L, s) == l + 1)
        return 1;  /* successful conversion to number */
      /* else not a number */
      luaL_checkany(L, 1);  /* (but there must be some parameter) */
    }
  }
  else {
    size_t l;
    const char *s;
    lua_Integer n = 0;  /* to avoid warnings */
    lua_Integer base = luaL_checkinteger(L, 2);
    luaL_checktype(L, 1, LUA_TSTRING);  /* no numbers as strings */
    s = lua_tolstring(L, 1, &l);
    luaL_argcheck(L, 2 <= base && base <= 36, 2, "base out of range");
    if (b_str2int(s, (int)base, &n) == s + l) {
      lua_pushinteger(L, n);
      return 1;
    }  /* else not a number */
  }  /* else not a number */
  luaL_pushfail(L);  /* not a number */
  return 1;
}